

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

uint32_t Rand_simple(uint32_t m)

{
  __pid_t _Var1;
  ulong uVar2;
  long lVar3;
  time_t v;
  uint32_t m_local;
  
  uVar2 = time((time_t *)0x0);
  lVar3 = Rand_simple::seed % (long)(ulong)m;
  _Var1 = getpid();
  Rand_simple::seed = lVar3 * 0x41c64e6d + 0x3039 + (uVar2 << 0x10 ^ uVar2 ^ (long)_Var1);
  return (uint32_t)(Rand_simple::seed % (long)(ulong)m);
}

Assistant:

uint32_t Rand_simple(uint32_t m)
{
	static time_t seed;
	time_t v = time(NULL);

#ifdef UNIX
	seed = LCRNG(seed % m) + ((v << 16) ^ v ^ getpid());
#elif defined(_WIN32)
	seed = LCRNG(seed % m) + ((v << 16) ^ v ^ GetCurrentProcessId());
#else
	seed = LCRNG(seed % m) + ((v << 16) ^ v);
#endif
	return (seed % m);
}